

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_false>
::grow(SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_false>
       *this,size_t MinSize)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  size_t sVar4;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *Dest;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
  *NewElts;
  size_t NewCapacity;
  size_t CurSize;
  size_t CurCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_false>
  *this_local;
  
  sVar4 = SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
          ::capacity(&this->
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
                    );
  pvVar1 = (this->
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
           ).super_SmallVectorBase.EndX;
  pvVar2 = (this->
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
           ).super_SmallVectorBase.BeginX;
  NewElts = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
             *)NextPowerOf2(sVar4 + 2);
  if (NewElts < MinSize) {
    NewElts = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
               *)MinSize;
  }
  Dest = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
          *)malloc((long)NewElts * 0x168);
  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>,false>
  ::
  uninitialized_move<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<11u,Fixpp::Type::String>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<198u,Fixpp::Type::String>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<105u,Fixpp::Type::String>>>*>
            ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
              *)(this->
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
                ).super_SmallVectorBase.BeginX,
             (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
              *)(this->
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
                ).super_SmallVectorBase.EndX,Dest);
  destroy_range((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
                 *)(this->
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
                   ).super_SmallVectorBase.BeginX,
                (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>
                 *)(this->
                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
                   ).super_SmallVectorBase.EndX);
  bVar3 = SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
          ::isSmall(&this->
                     super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
                   );
  if (!bVar3) {
    free((this->
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
         ).super_SmallVectorBase.BeginX);
  }
  SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
  ::setEnd(&this->
            super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
           ,Dest + ((long)pvVar1 - (long)pvVar2) / 0x168);
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
  ).super_SmallVectorBase.BeginX = Dest;
  (this->
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
  ).super_SmallVectorBase.CapacityX =
       (void *)((long)(this->
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<73U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<11U,_Fixpp::Type::String>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<198U,_Fixpp::Type::String>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<105U,_Fixpp::Type::String>_>_>,_void>
                      ).super_SmallVectorBase.BeginX + (long)NewElts * 0x168);
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}